

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

void SingleTreeSearchHelper
               (ON_RTreeNode *a_nodeA,ON_RTreeBranch *a_branchB,
               ON_RTreePairSearchCallbackResult *a_result)

{
  ON_RTreeBranch *a_rectA;
  int iVar1;
  bool bVar2;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar3;
  ON_RTreeNode *pOVar4;
  
  iVar1 = a_nodeA->m_count;
  pOVar4 = a_nodeA;
  if (a_nodeA->m_level < 1) {
    while( true ) {
      paVar3 = &pOVar4->m_branch[0].field_1;
      a_rectA = pOVar4->m_branch;
      if (a_nodeA->m_branch + iVar1 <= a_rectA) break;
      pOVar4 = (ON_RTreeNode *)paVar3;
      if (a_rectA < a_branchB) {
        bVar2 = PairSearchOverlapHelper(&a_rectA->m_rect,&a_branchB->m_rect,a_result->m_tolerance);
        if (bVar2) {
          (*a_result->m_resultCallback)
                    (a_result->m_context,(ON__INT_PTR)paVar3->m_child,
                     (ON__INT_PTR)(a_branchB->field_1).m_child);
        }
      }
    }
  }
  else {
    while( true ) {
      paVar3 = &pOVar4->m_branch[0].field_1;
      if (a_nodeA->m_branch + iVar1 <= pOVar4->m_branch) break;
      bVar2 = PairSearchOverlapHelper
                        (&pOVar4->m_branch[0].m_rect,&a_branchB->m_rect,a_result->m_tolerance);
      pOVar4 = (ON_RTreeNode *)paVar3;
      if (bVar2) {
        SingleTreeSearchHelper(paVar3->m_child,a_branchB,a_result);
      }
    }
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeNode* a_nodeA, const ON_RTreeBranch* a_branchB, ON_RTreePairSearchCallbackResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;

  if (a_nodeA->m_level > 0)
  {
    // branchA's have children nodes and a_branchB is a leaf
    while (branchA < branchAmax)
    {
      if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
      {
        SingleTreeSearchHelper(branchA->m_child, a_branchB, a_result);
      }
      branchA++;
    }
  }
  else
  {
    // branchA's are all leaves
    while (branchA < branchAmax)
    {
      if (branchA < a_branchB)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &a_branchB->m_rect, a_result->m_tolerance))
        {
          a_result->m_resultCallback(a_result->m_context, branchA->m_id, a_branchB->m_id);
        }
      }
      branchA++;
    }
  }
}